

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day.h
# Opt level: O3

int __thiscall Day::getLessonsNumber(Day *this)

{
  pointer pLVar1;
  int iVar2;
  long lVar3;
  bool *pbVar4;
  
  pLVar1 = (this->lessons).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->lessons).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pLVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 3) * -0x30c30c30c30c30c3;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    pbVar4 = &pLVar1->exist;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)*pbVar4;
      pbVar4 = pbVar4 + 0xa8;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    return iVar2;
  }
  return 0;
}

Assistant:

int Day::getLessonsNumber() {
    int number = 0;
    for (size_t i = 0; i < lessons.size(); i++) {
        if(lessons[i].exist == true) {
            number++;
        }
    }
    return number;
}